

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.h
# Opt level: O0

int32_t half_btf(int32_t w0,int32_t in0,int32_t w1,int32_t in1,int bit)

{
  int64_t intermediate;
  int64_t result_64;
  int bit_local;
  int32_t in1_local;
  int32_t w1_local;
  int32_t in0_local;
  int32_t w0_local;
  
  return (int32_t)((long)(w0 * in0) + (long)(w1 * in1) + (1L << ((byte)bit - 1 & 0x3f)) >>
                  ((byte)bit & 0x3f));
}

Assistant:

static inline int32_t half_btf(int32_t w0, int32_t in0, int32_t w1, int32_t in1,
                               int bit) {
  int64_t result_64 = (int64_t)(w0 * in0) + (int64_t)(w1 * in1);
  int64_t intermediate = result_64 + (1LL << (bit - 1));
  // NOTE(rachelbarker): The value 'result_64' may not necessarily fit
  // into 32 bits. However, the result of this function is nominally
  // ROUND_POWER_OF_TWO_64(result_64, bit)
  // and that is required to fit into stage_range[stage] many bits
  // (checked by range_check_buf()).
  //
  // Here we've unpacked that rounding operation, and it can be shown
  // that the value of 'intermediate' here *does* fit into 32 bits
  // for any conformant bitstream.
  // The upshot is that, if you do all this calculation using
  // wrapping 32-bit arithmetic instead of (non-wrapping) 64-bit arithmetic,
  // then you'll still get the correct result.
  // To provide a check on this logic, we assert that 'intermediate'
  // would fit into an int32 if range checking is enabled.
#if CONFIG_COEFFICIENT_RANGE_CHECKING
  assert(intermediate >= INT32_MIN && intermediate <= INT32_MAX);
#endif
  return (int32_t)(intermediate >> bit);
}